

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::AttachComments
          (LocationRecorder *this,string *leading,string *trailing)

{
  uint uVar1;
  LogMessage *pLVar2;
  string *psVar3;
  LogFinisher local_59;
  LogMessage local_58;
  
  uVar1 = this->location_->_has_bits_[0];
  if ((uVar1 & 4) != 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x16b);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_58,"CHECK failed: !location_->has_leading_comments(): ");
    internal::LogFinisher::operator=(&local_59,pLVar2);
    internal::LogMessage::~LogMessage(&local_58);
    uVar1 = this->location_->_has_bits_[0];
  }
  if ((uVar1 & 8) != 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x16c);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_58,"CHECK failed: !location_->has_trailing_comments(): ");
    internal::LogFinisher::operator=(&local_59,pLVar2);
    internal::LogMessage::~LogMessage(&local_58);
  }
  if (leading->_M_string_length != 0) {
    psVar3 = SourceCodeInfo_Location::mutable_leading_comments_abi_cxx11_(this->location_);
    std::__cxx11::string::swap((string *)psVar3);
  }
  if (trailing->_M_string_length != 0) {
    psVar3 = SourceCodeInfo_Location::mutable_trailing_comments_abi_cxx11_(this->location_);
    std::__cxx11::string::swap((string *)psVar3);
  }
  return;
}

Assistant:

void Parser::LocationRecorder::AttachComments(
    string* leading, string* trailing) const {
  GOOGLE_CHECK(!location_->has_leading_comments());
  GOOGLE_CHECK(!location_->has_trailing_comments());

  if (!leading->empty()) {
    location_->mutable_leading_comments()->swap(*leading);
  }
  if (!trailing->empty()) {
    location_->mutable_trailing_comments()->swap(*trailing);
  }
}